

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

ConstSchema __thiscall capnp::Schema::asConst(Schema *this)

{
  DebugExpression<bool> _kjCondition;
  Fault f;
  ArrayPtr<const_char> local_50;
  Reader local_40;
  
  getProto(&local_40,this);
  if (local_40._reader.dataSize < 0x70) {
    _kjCondition.value = false;
  }
  else {
    _kjCondition.value = *(short *)((long)local_40._reader.data + 0xc) == 4;
    if (_kjCondition.value) {
      return (ConstSchema)(Schema)this->raw;
    }
  }
  getProto(&local_40,this);
  local_50 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_40);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[48],capnp::Text::Reader>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0x133,FAILED,"getProto().isConst()",
             "_kjCondition,\"Tried to use non-constant schema as a constant.\", getProto().getDisplayName()"
             ,&_kjCondition,(char (*) [48])"Tried to use non-constant schema as a constant.",
             (Reader *)&local_50);
  kj::_::Debug::Fault::~Fault(&f);
  return (ConstSchema)((long)_::NULL_CONST_SCHEMA + 0x48);
}

Assistant:

ConstSchema Schema::asConst() const {
  KJ_REQUIRE(getProto().isConst(), "Tried to use non-constant schema as a constant.",
             getProto().getDisplayName()) {
    return ConstSchema();
  }
  return ConstSchema(*this);
}